

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharSetInner::ToComplement
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint base,
          CharSet<char16_t> *result)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  Char lc;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x228,"(level > 0)","level > 0");
    if (!bVar3) {
LAB_00e6dba5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  uVar5 = -1 << ((char)level * '\x04' + 4U & 0x1f);
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  iVar6 = ~uVar5 + base;
  lVar7 = 0;
  do {
    pCVar1 = this->children[lVar7];
    if (pCVar1 == (CharSetNode *)0x0) {
      lc = L'Ā';
      if (0x100 < base) {
        lc = (Char)base;
      }
      if (0xffff < base) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                           ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
        if (!bVar3) goto LAB_00e6dba5;
        *puVar4 = 0;
      }
      if (0xffff < ~uVar5 + base) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                           ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
        if (!bVar3) goto LAB_00e6dba5;
        *puVar4 = 0;
      }
      CharSet<char16_t>::SetRange(result,allocator,lc,(Char)iVar6);
    }
    else {
      (*pCVar1->_vptr_CharSetNode[6])(pCVar1,allocator,(ulong)(level - 1),(ulong)base,result);
    }
    base = base - uVar5;
    lVar7 = lVar7 + 1;
    iVar6 = iVar6 - uVar5;
    if (lVar7 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void CharSetInner::ToComplement(ArenaAllocator* allocator, uint level, uint base, CharSet<Char>& result) const
    {
        Assert(level > 0);
        level--;
        uint delta = lim(level) + 1;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] == nullptr)
                // Caution: Part of the range for this child may overlap with direct vector
                result.SetRange(allocator, UTC(max(base, directSize)), UTC(base + delta - 1));
            else
                children[i]->ToComplement(allocator, level, base, result);
            base += delta;
        }
    }